

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86_avx::forward(Padding_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  undefined8 *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_10;
  Mat borderm_3;
  int z_1;
  __m128 pad_value_7;
  int q_3;
  int outd_1;
  int outh_5;
  int outw_7;
  Mat m_7;
  __m128 pad_value_6;
  Mat borderm_2;
  int q_2;
  int front__1;
  size_t out_elemsize_5;
  int out_elempack_5;
  int outc_1;
  int outh_4;
  int outw_6;
  __m128 pad_value_5;
  size_t out_elemsize_4;
  int out_elempack_4;
  int outh_3;
  int outw_5;
  __m128 pad_value_4;
  size_t out_elemsize_3;
  int out_elempack_3;
  int outw_4;
  Mat m_4;
  Mat borderm_1;
  int z;
  __m256 pad_value_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m_1;
  __m256 pad_value_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  __m256 pad_value_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  __m256 pad_value;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *m_9;
  Mat *m_6;
  Mat *m_3;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  Mat *m_11;
  Mat *m_8;
  Mat *m_5;
  Mat *m_2;
  int i_3;
  float *ptr_3;
  int size_3;
  int i_2;
  float *ptr_2;
  int size_2;
  __m256 *in_stack_ffffffffffffe8c8;
  __m256 *v;
  int in_stack_ffffffffffffe8d0;
  int in_stack_ffffffffffffe8d4;
  int in_stack_ffffffffffffe8d8;
  int in_stack_ffffffffffffe8dc;
  Mat *in_stack_ffffffffffffe8e0;
  void **ppvVar11;
  int in_stack_ffffffffffffe8e8;
  int in_stack_ffffffffffffe8ec;
  int in_stack_ffffffffffffe8f0;
  int in_stack_ffffffffffffe8f4;
  undefined4 in_stack_ffffffffffffe8f8;
  int in_stack_ffffffffffffe8fc;
  Mat *in_stack_ffffffffffffe900;
  undefined7 in_stack_ffffffffffffe908;
  undefined1 in_stack_ffffffffffffe90f;
  int in_stack_ffffffffffffe948;
  Allocator *in_stack_ffffffffffffe950;
  Allocator *in_stack_ffffffffffffe958;
  undefined8 in_stack_ffffffffffffe988;
  undefined8 in_stack_ffffffffffffe990;
  Mat *in_stack_ffffffffffffe998;
  Mat *in_stack_ffffffffffffe9a0;
  undefined8 in_stack_ffffffffffffe9a8;
  int in_stack_ffffffffffffe9b0;
  int in_stack_ffffffffffffe9b4;
  Mat *in_stack_ffffffffffffe9b8;
  undefined7 in_stack_ffffffffffffe9c0;
  undefined1 in_stack_ffffffffffffe9c7;
  float local_15f0 [2];
  float afStack_15e8 [22];
  int local_1590;
  int local_157c;
  int local_156c;
  undefined8 in_stack_ffffffffffffeb08;
  undefined8 in_stack_ffffffffffffeb10;
  undefined4 in_stack_ffffffffffffeb18;
  undefined4 in_stack_ffffffffffffeb1c;
  Mat *in_stack_ffffffffffffeb20;
  undefined8 uVar12;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  int local_13c4;
  int local_13a8;
  int local_1390;
  int local_138c;
  Option *in_stack_ffffffffffffeca0;
  Mat *in_stack_ffffffffffffeca8;
  Mat *in_stack_ffffffffffffecb0;
  Padding *in_stack_ffffffffffffecb8;
  void *local_1320;
  int *local_1318;
  size_t local_1310;
  int local_1308;
  Allocator *local_1300;
  int local_12f8;
  int local_12f4;
  int local_12f0;
  int local_12ec;
  int local_12e8;
  size_t local_12e0;
  undefined8 local_12d8;
  undefined8 local_12d0;
  undefined8 local_12c8;
  undefined4 local_12c0;
  Option *in_stack_ffffffffffffed48;
  undefined4 in_stack_ffffffffffffed50;
  undefined4 in_stack_ffffffffffffed54;
  Mat *in_stack_ffffffffffffed58;
  undefined4 uVar13;
  Padding_x86_avx *in_stack_ffffffffffffed60;
  Mat local_1290;
  undefined8 local_1248;
  undefined8 local_1240;
  undefined8 local_1238;
  undefined4 local_1230;
  Allocator *local_1228;
  undefined4 local_1220;
  undefined4 local_121c;
  undefined4 local_1218;
  undefined4 local_1214;
  undefined4 local_1210;
  undefined8 local_1208;
  Mat local_1200;
  int local_11b4;
  float local_11b0 [2];
  float afStack_11a8 [4];
  int local_1198;
  int local_1194;
  int local_1190;
  int local_118c;
  Mat local_1188;
  float local_1140 [2];
  float afStack_1138 [4];
  Mat local_1128;
  int local_10e0;
  int local_10dc;
  long local_10d8;
  int local_10d0;
  int local_10cc;
  int local_10c8;
  int local_10c4;
  float local_10c0 [2];
  float afStack_10b8 [4];
  long local_10a8;
  int local_109c;
  int local_1098;
  int local_1094;
  float local_1090 [2];
  float afStack_1088 [4];
  long local_1078;
  int local_1070;
  int local_106c;
  undefined8 local_1068;
  undefined8 local_1060;
  undefined8 local_1058;
  undefined4 local_1050;
  Allocator *local_1048;
  undefined4 local_1040;
  undefined4 local_103c;
  undefined4 local_1038;
  undefined4 local_1034;
  undefined4 local_1030;
  undefined8 local_1028;
  void *local_1020;
  int *local_1018;
  size_t local_1010;
  int local_1008;
  Allocator *local_1000;
  undefined4 local_ff8;
  int local_ff4;
  int local_ff0;
  undefined4 local_fec;
  undefined4 local_fe8;
  long local_fe0;
  undefined8 local_fd8;
  undefined8 local_fd0;
  undefined8 local_fc8;
  undefined4 local_fc0;
  Allocator *local_fb8;
  undefined4 local_fb0;
  undefined4 local_fac;
  undefined4 local_fa8;
  undefined4 local_fa4;
  undefined4 local_fa0;
  undefined8 local_f98;
  undefined1 (*local_f90) [32];
  int *local_f88;
  size_t local_f80;
  int local_f78;
  Allocator *local_f70;
  undefined4 local_f68;
  int local_f64;
  int local_f60;
  undefined4 local_f5c;
  undefined4 local_f58;
  long local_f50;
  int local_f44;
  undefined1 local_f40 [32];
  int local_f08;
  int local_f04;
  int local_f00;
  int local_efc;
  void *local_ef8;
  int *local_ef0;
  ulong local_ee8;
  int local_ee0;
  Allocator *local_ed8;
  int local_ed0;
  int local_ecc;
  int local_ec8;
  undefined4 local_ec4;
  int local_ec0;
  ulong local_eb8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 *local_e68;
  int *local_e60;
  ulong local_e58;
  int local_e50;
  Allocator *local_e48;
  int local_e40;
  int local_e3c;
  int local_e38;
  undefined4 local_e34;
  int local_e30;
  ulong local_e28;
  int local_e20;
  int local_e1c;
  long local_e18;
  int local_e10;
  int local_e0c;
  int local_e08;
  int local_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  long local_dd8;
  int local_dcc;
  int local_dc8;
  int local_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  long local_d88;
  int local_d7c;
  int local_d78;
  int local_d74;
  ulong local_d70;
  int local_d68;
  int local_d64;
  int local_d60;
  int local_d5c;
  int local_d58;
  int local_d54;
  Mat *local_d48;
  Mat *local_d40;
  int local_d2c;
  int local_d28;
  undefined4 local_d24;
  Mat *local_d20;
  void **local_d00;
  Mat *local_cf8;
  Mat *local_cf0;
  Mat *local_ce8;
  Mat *local_ce0;
  Mat *local_cd8;
  Mat *local_cd0;
  Mat *local_cc8;
  Mat *local_cc0;
  uint local_cb8;
  uint local_cb4;
  uint local_cb0;
  uint local_cac;
  undefined1 local_ca5;
  int local_ca4;
  undefined8 *local_c98;
  undefined1 local_c8d;
  int local_c8c;
  Mat *local_c80;
  undefined1 local_c75;
  int local_c74;
  undefined8 *local_c68;
  undefined1 local_c5d;
  int local_c5c;
  undefined8 **local_c50;
  undefined8 *local_c48;
  undefined8 *local_c40;
  long *local_c38;
  long *local_c30;
  long *local_c28;
  long *local_c20;
  int local_c14;
  undefined1 (*local_c10) [32];
  int local_c08;
  undefined4 local_c04;
  undefined1 local_c00 [32];
  undefined1 (**local_be0) [32];
  int local_bd4;
  undefined8 *local_bd0;
  int local_bc8;
  undefined4 local_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 **local_b88;
  undefined1 local_b7d;
  int local_b7c;
  undefined8 *local_b70;
  undefined1 local_b65;
  int local_b64;
  Mat *local_b58;
  undefined1 local_b4d;
  int local_b4c;
  undefined8 *local_b40;
  undefined1 local_b35;
  int local_b34;
  void **local_b28;
  void **local_ae0;
  undefined8 **local_ad0;
  undefined8 *local_ac0;
  undefined8 *local_ab0;
  void **local_aa0;
  undefined1 (**local_a90) [32];
  Mat *local_a80;
  Mat *local_a70;
  undefined8 *local_a60;
  undefined8 *local_a50;
  Mat *local_a40;
  Mat *local_a30;
  void **local_a20;
  int local_a0c;
  undefined8 *local_a08;
  Mat *local_a00;
  int local_9f4;
  undefined8 *local_9f0;
  undefined1 (**local_9e8) [32];
  int local_9dc;
  undefined8 *local_9d8;
  Mat *local_9d0;
  int local_9c4;
  undefined8 *local_9c0;
  void **local_9b8;
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_994;
  float local_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_974;
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_954;
  float local_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float local_93c;
  float *local_938;
  float *local_930;
  int local_924;
  float *local_920;
  int local_914;
  float local_910 [2];
  float afStack_908 [2];
  Mat *local_900;
  int local_8f4;
  float *local_8f0;
  int local_8e4;
  float local_8e0 [2];
  float afStack_8d8 [4];
  Mat *local_8c8;
  void **local_8b8;
  int local_8a0;
  undefined4 local_89c;
  void **local_898;
  int local_880;
  undefined4 local_87c;
  Mat *local_878;
  int local_860;
  undefined4 local_85c;
  Mat *local_858;
  undefined8 *local_838;
  undefined8 *local_818;
  int local_800;
  undefined4 local_7fc;
  Mat *local_7f8;
  int local_7e0;
  undefined4 local_7dc;
  Mat *local_7d8;
  int local_7c0;
  undefined4 local_7bc;
  undefined1 (**local_7b8) [32];
  int local_7a0;
  undefined4 local_79c;
  void **local_798;
  undefined8 *local_778;
  undefined8 *local_758;
  int local_740;
  undefined4 local_73c;
  undefined8 **local_738;
  int local_720;
  undefined4 local_71c;
  void **local_718;
  int local_690;
  undefined4 local_68c;
  void *local_680;
  void *local_638;
  undefined8 *local_628;
  void *local_5f8;
  undefined1 (*local_5e8) [32];
  void *local_5d8;
  float *local_5c8;
  void *local_598;
  float *local_588;
  void *local_578;
  Mat *local_568;
  Mat *local_560;
  undefined8 **local_558;
  undefined1 (**local_550) [32];
  Mat *local_548;
  Mat *local_540;
  Mat *local_538;
  Mat *local_530;
  Mat *local_528;
  Mat *local_520;
  Mat *local_518;
  Mat *local_510;
  void **local_508;
  undefined1 local_500 [32];
  uint local_4e0;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  uint local_4d0;
  uint local_4cc;
  uint local_4c8;
  uint local_4c4;
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint local_49c;
  uint local_498;
  uint local_494;
  uint local_490;
  uint local_48c;
  uint local_488;
  uint local_484;
  undefined1 local_480 [32];
  uint local_460;
  uint local_45c;
  uint local_458;
  uint local_454;
  uint local_450;
  uint local_44c;
  uint local_448;
  uint local_444;
  undefined1 local_440 [32];
  uint local_420;
  uint local_41c;
  uint local_418;
  uint local_414;
  uint local_410;
  uint local_40c;
  uint local_408;
  uint local_404;
  Allocator *local_400;
  int local_3f4;
  ulong local_3f0;
  void *local_3e8;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  void **local_3d0;
  Allocator *local_3c8;
  int local_3bc;
  size_t local_3b8;
  void *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  undefined8 *local_398;
  Allocator *local_390;
  int local_384;
  ulong local_380;
  void *local_378;
  int local_36c;
  int local_368;
  int local_364;
  Mat *local_360;
  Allocator *local_358;
  int local_34c;
  size_t local_348;
  void *local_340;
  int local_334;
  int local_330;
  int local_32c;
  undefined8 *local_328;
  Allocator *local_320;
  int local_314;
  ulong local_310;
  undefined8 *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  undefined8 **local_2f0;
  Allocator *local_2e8;
  int local_2dc;
  size_t local_2d8;
  void *local_2d0;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  undefined8 *local_2b8;
  Allocator *local_2b0;
  int local_2a4;
  ulong local_2a0;
  float *local_298;
  int local_28c;
  int local_288;
  int local_284;
  Mat *local_280;
  Allocator *local_278;
  int local_26c;
  size_t local_268;
  void *local_260;
  int local_254;
  int local_250;
  int local_24c;
  undefined8 *local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 (*local_148) [32];
  Allocator *local_140;
  int local_134;
  size_t local_130;
  void *local_128;
  int local_120;
  int local_11c;
  void **local_118;
  int local_104;
  size_t local_100;
  void *local_f8;
  int local_f0;
  Mat *local_e8;
  Allocator *local_e0;
  int local_d4;
  size_t local_d0;
  undefined1 (*local_c8) [32];
  int local_c0;
  int local_bc;
  undefined1 (**local_b8) [32];
  Allocator *local_b0;
  int local_a4;
  size_t local_a0;
  float *local_98;
  int local_90;
  int local_8c;
  Mat *local_88;
  float local_80 [2];
  float afStack_78 [4];
  float *local_68;
  float local_60 [2];
  float afStack_58 [4];
  float *local_48;
  int local_40;
  undefined4 local_3c;
  void **local_38;
  
  if (((((*(int *)(in_RDI + 0xd0) == 0) && (*(int *)(in_RDI + 0xd4) == 0)) &&
       (*(int *)(in_RDI + 0xd8) == 0)) &&
      ((*(int *)(in_RDI + 0xdc) == 0 && (*(int *)(in_RDI + 0xe8) == 0)))) &&
     (*(int *)(in_RDI + 0xec) == 0)) {
    if (in_RDX != in_RSI) {
      if (in_RSI->refcount != (int *)0x0) {
        piVar1 = in_RSI->refcount;
        local_d24 = 1;
        LOCK();
        local_d28 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_d20 = in_RSI;
      if (in_RDX->refcount != (int *)0x0) {
        piVar1 = in_RDX->refcount;
        local_68c = 0xffffffff;
        LOCK();
        local_690 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_690 == 1) {
          if (in_RDX->allocator == (Allocator *)0x0) {
            local_680 = in_RDX->data;
            if (local_680 != (void *)0x0) {
              free(local_680);
            }
          }
          else {
            (*in_RDX->allocator->_vptr_Allocator[3])(in_RDX->allocator,in_RDX->data);
          }
        }
      }
      in_RDX->data = (void *)0x0;
      in_RDX->elemsize = 0;
      in_RDX->elempack = 0;
      in_RDX->dims = 0;
      in_RDX->w = 0;
      in_RDX->h = 0;
      in_RDX->d = 0;
      in_RDX->c = 0;
      in_RDX->cstep = 0;
      in_RDX->refcount = (int *)0x0;
      in_RDX->data = local_d20->data;
      in_RDX->refcount = local_d20->refcount;
      in_RDX->elemsize = local_d20->elemsize;
      in_RDX->elempack = local_d20->elempack;
      in_RDX->allocator = local_d20->allocator;
      in_RDX->dims = local_d20->dims;
      in_RDX->w = local_d20->w;
      in_RDX->h = local_d20->h;
      in_RDX->d = local_d20->d;
      in_RDX->c = local_d20->c;
      in_RDX->cstep = local_d20->cstep;
    }
    return 0;
  }
  if (in_RSI->elempack == 0) {
    local_138c = 0;
  }
  else {
    uVar5 = in_RSI->elemsize << 3;
    local_138c = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) /
                      (long)in_RSI->elempack);
  }
  local_d54 = local_138c;
  if (local_138c == 8) {
    iVar4 = forward_int8(in_stack_ffffffffffffed60,in_stack_ffffffffffffed58,
                         (Mat *)CONCAT44(in_stack_ffffffffffffed54,in_stack_ffffffffffffed50),
                         in_stack_ffffffffffffed48);
    return iVar4;
  }
  local_d58 = in_RSI->w;
  local_d5c = in_RSI->h;
  local_d60 = in_RSI->d;
  local_d64 = in_RSI->c;
  local_d68 = in_RSI->dims;
  local_d70 = in_RSI->elemsize;
  local_d74 = in_RSI->elempack;
  iVar4 = (int)((ulong)in_stack_ffffffffffffe8e0 >> 0x20);
  local_d48 = in_RDX;
  local_d40 = in_RSI;
  if (local_d74 == 8) {
    if (local_d68 == 1) {
      local_d78 = local_d58 * 8 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      if (local_d78 % 8 == 0) {
        local_1390 = 8;
      }
      else {
        local_1390 = 1;
        if (local_d78 % 4 == 0) {
          local_1390 = 4;
        }
      }
      local_d7c = local_1390;
      local_d88 = (local_d70 / 8) * (long)local_1390;
      if (((*(int *)(in_RDI + 0xd8) % 8 == 0) && (local_1390 == 8)) &&
         (*(int *)(in_RDI + 0xe0) == 0)) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                    in_stack_ffffffffffffe8f4,
                    CONCAT44(in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8),iVar4,
                    (Allocator *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
        local_cc0 = local_d48;
        bVar6 = true;
        if (local_d48->data != (void *)0x0) {
          local_548 = local_d48;
          bVar6 = local_d48->cstep * (long)local_d48->c == 0;
        }
        if (!bVar6) {
          local_cac = *(uint *)(in_RDI + 0xe4);
          auVar2 = vinsertps_avx(ZEXT416(local_cac),ZEXT416(local_cac),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_cac),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_cac),0x30);
          auVar3 = vinsertps_avx(ZEXT416(local_cac),ZEXT416(local_cac),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_cac),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_cac),0x30);
          auVar7._16_16_ = auVar2;
          auVar7._0_16_ = auVar3;
          local_500._0_8_ = auVar3._0_8_;
          local_500._8_8_ = auVar3._8_8_;
          local_500._16_8_ = auVar2._0_8_;
          local_500._24_8_ = auVar2._8_8_;
          local_dc0 = local_500._0_8_;
          uStack_db8 = local_500._8_8_;
          uStack_db0 = local_500._16_8_;
          uStack_da8 = local_500._24_8_;
          local_500 = auVar7;
          local_4e0 = local_cac;
          local_4dc = local_cac;
          local_4d8 = local_cac;
          local_4d4 = local_cac;
          local_4d0 = local_cac;
          local_4cc = local_cac;
          local_4c8 = local_cac;
          local_4c4 = local_cac;
          padding_constant_pack8_avx
                    (in_stack_ffffffffffffe900,
                     (Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                     in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8ec,
                     in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8c8);
          return 0;
        }
        return -100;
      }
    }
    if (local_d68 == 2) {
      local_dc4 = local_d58 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_dc8 = local_d5c * 8 + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      if (local_dc8 % 8 == 0) {
        local_13a8 = 8;
      }
      else {
        local_13a8 = 1;
        if (local_dc8 % 4 == 0) {
          local_13a8 = 4;
        }
      }
      local_dcc = local_13a8;
      local_dd8 = (local_d70 / 8) * (long)local_13a8;
      if (((*(int *)(in_RDI + 0xd0) % 8 == 0) && (local_13a8 == 8)) &&
         (*(int *)(in_RDI + 0xe0) == 0)) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                    in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0,
                    CONCAT44(in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8),iVar4,
                    (Allocator *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
        local_cc8 = local_d48;
        bVar6 = true;
        if (local_d48->data != (void *)0x0) {
          local_540 = local_d48;
          bVar6 = local_d48->cstep * (long)local_d48->c == 0;
        }
        if (!bVar6) {
          local_cb0 = *(uint *)(in_RDI + 0xe4);
          auVar2 = vinsertps_avx(ZEXT416(local_cb0),ZEXT416(local_cb0),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_cb0),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_cb0),0x30);
          auVar3 = vinsertps_avx(ZEXT416(local_cb0),ZEXT416(local_cb0),0x10);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_cb0),0x20);
          auVar3 = vinsertps_avx(auVar3,ZEXT416(local_cb0),0x30);
          auVar8._16_16_ = auVar2;
          auVar8._0_16_ = auVar3;
          local_4c0._0_8_ = auVar3._0_8_;
          local_4c0._8_8_ = auVar3._8_8_;
          local_4c0._16_8_ = auVar2._0_8_;
          local_4c0._24_8_ = auVar2._8_8_;
          local_e00 = local_4c0._0_8_;
          uStack_df8 = local_4c0._8_8_;
          uStack_df0 = local_4c0._16_8_;
          uStack_de8 = local_4c0._24_8_;
          local_4c0 = auVar8;
          local_4a0 = local_cb0;
          local_49c = local_cb0;
          local_498 = local_cb0;
          local_494 = local_cb0;
          local_490 = local_cb0;
          local_48c = local_cb0;
          local_488 = local_cb0;
          local_484 = local_cb0;
          padding_constant_pack8_avx
                    (in_stack_ffffffffffffe900,
                     (Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                     in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8ec,
                     in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8c8);
          return 0;
        }
        return -100;
      }
    }
    if (local_d68 == 3) {
      local_e04 = local_d58 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_e08 = local_d5c + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      local_e0c = local_d64 * 8 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
      if (local_e0c % 8 == 0) {
        local_13c4 = 8;
      }
      else {
        local_13c4 = 1;
        if (local_e0c % 4 == 0) {
          local_13c4 = 4;
        }
      }
      local_e10 = local_13c4;
      local_e18 = (local_d70 / 8) * (long)local_13c4;
      if (((*(int *)(in_RDI + 0xe8) % 8 == 0) && (local_13c4 == 8)) &&
         ((local_e0c == local_d64 * 8 || (*(int *)(in_RDI + 0xe0) == 0)))) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                    in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8ec,
                    (size_t)in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
                    in_stack_ffffffffffffe958);
        local_cd0 = local_d48;
        bVar6 = true;
        if (local_d48->data != (void *)0x0) {
          local_538 = local_d48;
          bVar6 = local_d48->cstep * (long)local_d48->c == 0;
        }
        if (!bVar6) {
          local_e1c = *(int *)(in_RDI + 0xe8) / local_d74;
          for (local_e20 = 0; local_e20 < local_e0c / local_e10; local_e20 = local_e20 + 1) {
            local_c50 = &local_e68;
            local_2f4 = local_d48->w;
            local_2f8 = local_d48->h;
            local_2fc = local_d48->d;
            local_308 = (undefined8 *)
                        ((long)local_d48->data +
                        local_d48->cstep * (long)local_e20 * local_d48->elemsize);
            local_310 = local_d48->elemsize;
            local_314 = local_d48->elempack;
            local_320 = local_d48->allocator;
            local_2f0 = &local_e68;
            local_e60 = (int *)0x0;
            local_e34 = 1;
            local_208 = (long)local_2f4 * (long)local_2f8 * local_310;
            local_e28 = (local_208 + 0xfU & 0xfffffffffffffff0) / local_310;
            local_e40 = local_d48->dims + -1;
            if (local_d48->dims == 4) {
              local_e28 = (long)local_d48->w * (long)local_d48->h;
            }
            local_20c = 0x10;
            local_c5c = local_e20;
            local_c5d = 1;
            if (*(int *)(in_RDI + 0xf0) == 0) {
              local_cb4 = *(uint *)(in_RDI + 0xe4);
              auVar2 = vinsertps_avx(ZEXT416(local_cb4),ZEXT416(local_cb4),0x10);
              auVar2 = vinsertps_avx(auVar2,ZEXT416(local_cb4),0x20);
              auVar2 = vinsertps_avx(auVar2,ZEXT416(local_cb4),0x30);
              auVar3 = vinsertps_avx(ZEXT416(local_cb4),ZEXT416(local_cb4),0x10);
              auVar3 = vinsertps_avx(auVar3,ZEXT416(local_cb4),0x20);
              auVar3 = vinsertps_avx(auVar3,ZEXT416(local_cb4),0x30);
              auVar9._16_16_ = auVar2;
              auVar9._0_16_ = auVar3;
              local_480._0_8_ = auVar3._0_8_;
              local_480._8_8_ = auVar3._8_8_;
              local_480._16_8_ = auVar2._0_8_;
              local_480._24_8_ = auVar2._8_8_;
              local_1440 = local_480._0_8_;
              uStack_1438 = local_480._8_8_;
              uStack_1430 = local_480._16_8_;
              uStack_1428 = local_480._24_8_;
              local_480 = auVar9;
              local_460 = local_cb4;
              local_45c = local_cb4;
              local_458 = local_cb4;
              local_454 = local_cb4;
              local_450 = local_cb4;
              local_44c = local_cb4;
              local_448 = local_cb4;
              local_444 = local_cb4;
            }
            else {
              local_c20 = (long *)(in_RDI + 0xf8);
              local_c40 = (undefined8 *)(*local_c20 + (long)(local_e20 << 3) * 4);
              local_1440 = *local_c40;
              uStack_1438 = local_c40[1];
              uStack_1430 = local_c40[2];
              uStack_1428 = local_c40[3];
            }
            local_ea0 = local_1440;
            uStack_e98 = uStack_1438;
            uStack_e90 = uStack_1430;
            uStack_e88 = uStack_1428;
            local_e68 = local_308;
            local_e58 = local_310;
            local_e50 = local_314;
            local_e48 = local_320;
            local_e3c = local_2f4;
            local_e38 = local_2f8;
            local_e30 = local_2fc;
            if ((local_e20 - local_e1c < 0) || (local_d64 <= local_e20 - local_e1c)) {
              local_b88 = &local_e68;
              local_bc0 = local_1440;
              uStack_bb8 = uStack_1438;
              uStack_bb0 = uStack_1430;
              uStack_ba8 = uStack_1428;
              local_bc4 = 0;
              local_bc8 = (int)local_e28 * local_2fc;
              local_bd0 = local_308;
              for (local_bd4 = 0; local_558 = local_b88, local_bd4 < local_bc8;
                  local_bd4 = local_bd4 + 1) {
                local_188 = local_bd0;
                local_1c0 = local_1440;
                uStack_1b8 = uStack_1438;
                uStack_1b0 = uStack_1430;
                uStack_1a8 = uStack_1428;
                *local_bd0 = local_1440;
                local_bd0[1] = uStack_1438;
                local_bd0[2] = uStack_1430;
                local_bd0[3] = uStack_1428;
                local_bd0 = local_bd0 + 4;
              }
            }
            else {
              local_b34 = local_e20 - local_e1c;
              local_b28 = &local_ef8;
              local_3d4 = local_d40->w;
              local_3d8 = local_d40->h;
              local_3dc = local_d40->d;
              local_3e8 = (void *)((long)local_d40->data +
                                  local_d40->cstep * (long)local_b34 * local_d40->elemsize);
              local_3f0 = local_d40->elemsize;
              local_3f4 = local_d40->elempack;
              local_400 = local_d40->allocator;
              local_3d0 = &local_ef8;
              local_ef0 = (int *)0x0;
              local_ec4 = 1;
              local_1c8 = (long)local_3d4 * (long)local_3d8 * local_3f0;
              local_eb8 = (local_1c8 + 0xfU & 0xfffffffffffffff0) / local_3f0;
              local_ed0 = local_d40->dims + -1;
              if (local_d40->dims == 4) {
                local_eb8 = (long)local_d40->w * (long)local_d40->h;
              }
              local_1cc = 0x10;
              local_20c = 0x10;
              local_b35 = 1;
              local_c5d = 1;
              local_ef8 = local_3e8;
              local_ee8 = local_3f0;
              local_ee0 = local_3f4;
              local_ed8 = local_400;
              local_ecc = local_3d4;
              local_ec8 = local_3d8;
              local_ec0 = local_3dc;
              if (*(int *)(in_RDI + 0xe0) == 0) {
                padding_constant_pack8_avx
                          (in_stack_ffffffffffffe900,
                           (Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                           in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0,
                           in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8,
                           in_stack_ffffffffffffe8c8);
              }
              if (*(int *)(in_RDI + 0xe0) == 1) {
                padding_replicate_pack8_avx
                          ((Mat *)CONCAT17(in_stack_ffffffffffffe9c7,in_stack_ffffffffffffe9c0),
                           in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b4,
                           in_stack_ffffffffffffe9b0,(int)((ulong)in_stack_ffffffffffffe9a8 >> 0x20)
                           ,(int)in_stack_ffffffffffffe9a8);
              }
              if (*(int *)(in_RDI + 0xe0) == 2) {
                padding_reflect_pack8_avx
                          (in_stack_ffffffffffffeb20,
                           (Mat *)CONCAT44(in_stack_ffffffffffffeb1c,in_stack_ffffffffffffeb18),
                           (int)((ulong)in_stack_ffffffffffffeb10 >> 0x20),
                           (int)in_stack_ffffffffffffeb10,
                           (int)((ulong)in_stack_ffffffffffffeb08 >> 0x20),
                           (int)in_stack_ffffffffffffeb08);
              }
              local_ae0 = &local_ef8;
              local_718 = local_ae0;
              if (local_ef0 != (int *)0x0) {
                local_71c = 0xffffffff;
                LOCK();
                local_720 = *local_ef0;
                *local_ef0 = *local_ef0 + -1;
                UNLOCK();
                if (local_720 == 1) {
                  if (local_ed8 == (Allocator *)0x0) {
                    local_638 = local_ef8;
                    if (local_ef8 != (void *)0x0) {
                      free(local_ef8);
                    }
                  }
                  else {
                    (*local_ed8->_vptr_Allocator[3])(local_ed8,local_ef8);
                  }
                }
              }
              local_ef8 = (void *)0x0;
              local_ee8 = 0;
              local_ee0 = 0;
              local_ed0 = 0;
              local_ecc = 0;
              local_ec8 = 0;
              local_ec4 = 0;
              local_ec0 = 0;
              local_eb8 = 0;
              local_ef0 = (int *)0x0;
            }
            local_ad0 = &local_e68;
            local_738 = local_ad0;
            if (local_e60 != (int *)0x0) {
              local_73c = 0xffffffff;
              LOCK();
              local_740 = *local_e60;
              *local_e60 = *local_e60 + -1;
              UNLOCK();
              if (local_740 == 1) {
                if (local_e48 == (Allocator *)0x0) {
                  local_628 = local_e68;
                  if (local_e68 != (undefined8 *)0x0) {
                    free(local_e68);
                  }
                }
                else {
                  (*local_e48->_vptr_Allocator[3])(local_e48,local_e68);
                }
              }
            }
          }
          return 0;
        }
        return -100;
      }
    }
    if (local_d68 == 4) {
      local_efc = local_d58 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_f00 = local_d5c + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      local_f04 = local_d60 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
      if (*(int *)(in_RDI + 0xe0) == 0) {
        v = (__m256 *)in_RCX[1];
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8),iVar4,
                    (int)in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
                    in_stack_ffffffffffffe8d8,
                    CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
                    in_stack_ffffffffffffe948,in_stack_ffffffffffffe950);
        local_cd8 = local_d48;
        bVar6 = true;
        if (local_d48->data != (void *)0x0) {
          local_530 = local_d48;
          bVar6 = local_d48->cstep * (long)local_d48->c == 0;
        }
        if (!bVar6) {
          for (local_f08 = 0; local_f08 < local_d64; local_f08 = local_f08 + 1) {
            if (*(int *)(in_RDI + 0xf0) == 0) {
              local_cb8 = *(uint *)(in_RDI + 0xe4);
              auVar2 = vinsertps_avx(ZEXT416(local_cb8),ZEXT416(local_cb8),0x10);
              auVar2 = vinsertps_avx(auVar2,ZEXT416(local_cb8),0x20);
              auVar2 = vinsertps_avx(auVar2,ZEXT416(local_cb8),0x30);
              auVar3 = vinsertps_avx(ZEXT416(local_cb8),ZEXT416(local_cb8),0x10);
              auVar3 = vinsertps_avx(auVar3,ZEXT416(local_cb8),0x20);
              auVar3 = vinsertps_avx(auVar3,ZEXT416(local_cb8),0x30);
              auVar10._16_16_ = auVar2;
              auVar10._0_16_ = auVar3;
              local_440._0_8_ = auVar3._0_8_;
              local_440._8_8_ = auVar3._8_8_;
              local_440._16_8_ = auVar2._0_8_;
              local_440._24_8_ = auVar2._8_8_;
              uStack_14d8 = local_440._8_8_;
              uStack_14d0 = local_440._16_8_;
              uStack_14c8 = local_440._24_8_;
              uVar12 = local_440._0_8_;
              local_440 = auVar10;
              local_420 = local_cb8;
              local_41c = local_cb8;
              local_418 = local_cb8;
              local_414 = local_cb8;
              local_410 = local_cb8;
              local_40c = local_cb8;
              local_408 = local_cb8;
              local_404 = local_cb8;
            }
            else {
              local_c28 = (long *)(in_RDI + 0xf8);
              local_c48 = (undefined8 *)(*local_c28 + (long)(local_f08 << 3) * 4);
              uStack_14d8 = local_c48[1];
              uStack_14d0 = local_c48[2];
              uStack_14c8 = local_c48[3];
              uVar12 = *local_c48;
            }
            local_f40._8_8_ = uStack_14d8;
            local_f40._0_8_ = uVar12;
            local_f40._16_8_ = uStack_14d0;
            local_f40._24_8_ = uStack_14c8;
            for (local_f44 = 0; local_f44 < local_f04; local_f44 = local_f44 + 1) {
              local_c68 = &local_fd8;
              local_2bc = local_d48->w;
              local_2c0 = local_d48->h;
              local_2c4 = local_d48->d;
              local_2d0 = (void *)((long)local_d48->data +
                                  local_d48->cstep * (long)local_f08 * local_d48->elemsize);
              local_2d8 = local_d48->elemsize;
              local_2dc = local_d48->elempack;
              local_2e8 = local_d48->allocator;
              local_2b8 = &local_fd8;
              local_218 = (long)local_2bc * (long)local_2c0 * local_2d8;
              local_9e8 = &local_f90;
              local_9f0 = &local_fd8;
              local_c8 = (undefined1 (*) [32])
                         ((long)local_2d0 +
                         (long)local_2bc * (long)local_2c0 * (long)local_f44 * local_2d8);
              local_b8 = &local_f90;
              local_f50 = (long)local_2bc * (long)local_2c0;
              local_ac0 = &local_fd8;
              local_f58 = 1;
              local_f5c = 1;
              local_f68 = 2;
              local_f88 = (int *)0x0;
              local_21c = 0x10;
              local_9f4 = local_f44;
              local_c74 = local_f08;
              local_c75 = 1;
              local_fd8 = 0;
              local_fc8 = 0;
              local_fc0 = 0;
              local_fb0 = 0;
              local_fac = 0;
              local_fa8 = 0;
              local_fa4 = 0;
              local_fa0 = 0;
              local_f98 = 0;
              local_fd0 = 0;
              local_758 = local_ac0;
              local_e0 = local_2e8;
              local_d4 = local_2dc;
              local_d0 = local_2d8;
              local_c0 = local_2c0;
              local_bc = local_2bc;
              local_fb8 = local_2e8;
              local_f90 = local_c8;
              local_f80 = local_2d8;
              local_f78 = local_2dc;
              local_f70 = local_2e8;
              local_f64 = local_2bc;
              local_f60 = local_2c0;
              if ((local_f44 - *(int *)(in_RDI + 0xe8) < 0) ||
                 (local_d60 <= local_f44 - *(int *)(in_RDI + 0xe8))) {
                local_be0 = &local_f90;
                local_c00 = local_f40;
                auVar7 = local_c00;
                local_c04 = 0;
                local_c08 = (int)local_f50;
                local_c10 = local_c8;
                for (local_c14 = 0; local_c00 = auVar7, local_550 = local_be0, local_c14 < local_c08
                    ; local_c14 = local_c14 + 1) {
                  local_148 = local_c10;
                  local_c00._0_8_ = local_f40._0_8_;
                  local_180 = local_c00._0_8_;
                  local_c00._8_8_ = local_f40._8_8_;
                  uStack_178 = local_c00._8_8_;
                  local_c00._16_8_ = local_f40._16_8_;
                  uStack_170 = local_c00._16_8_;
                  local_c00._24_8_ = local_f40._24_8_;
                  uStack_168 = local_c00._24_8_;
                  *local_c10 = local_f40;
                  local_c10 = local_c10 + 1;
                }
              }
              else {
                local_b40 = &local_1068;
                local_39c = local_d40->w;
                local_3a0 = local_d40->h;
                local_3a4 = local_d40->d;
                local_3b0 = (void *)((long)local_d40->data +
                                    local_d40->cstep * (long)local_f08 * local_d40->elemsize);
                local_3b8 = local_d40->elemsize;
                local_3bc = local_d40->elempack;
                local_3c8 = local_d40->allocator;
                local_398 = &local_1068;
                local_1d8 = (long)local_39c * (long)local_3a0 * local_3b8;
                local_9c4 = local_f44 - *(int *)(in_RDI + 0xe8);
                local_9b8 = &local_1020;
                local_9c0 = &local_1068;
                local_128 = (void *)((long)local_3b0 +
                                    (long)local_39c * (long)local_3a0 * (long)local_9c4 * local_3b8)
                ;
                local_118 = &local_1020;
                local_fe0 = (long)local_39c * (long)local_3a0;
                local_ab0 = &local_1068;
                local_f58 = 1;
                local_f5c = 1;
                local_f68 = 2;
                local_f88 = (int *)0x0;
                local_fa0 = 0;
                local_fa4 = 0;
                local_fa8 = 0;
                local_fac = 0;
                local_fc0 = 0;
                local_fc8 = 0;
                local_fd0 = 0;
                local_fd8 = 0;
                local_fe8 = 1;
                local_fec = 1;
                local_ff8 = 2;
                local_1018 = (int *)0x0;
                local_1dc = 0x10;
                local_21c = 0x10;
                local_b4c = local_f08;
                local_b4d = 1;
                local_c75 = 1;
                local_f98 = 0;
                local_fb0 = 0;
                local_1068 = 0;
                local_1058 = 0;
                local_1050 = 0;
                local_1040 = 0;
                local_103c = 0;
                local_1038 = 0;
                local_1034 = 0;
                local_1030 = 0;
                local_1028 = 0;
                local_1060 = 0;
                local_778 = local_ab0;
                local_140 = local_3c8;
                local_134 = local_3bc;
                local_130 = local_3b8;
                local_120 = local_3a0;
                local_11c = local_39c;
                local_1048 = local_3c8;
                local_1020 = local_128;
                local_1010 = local_3b8;
                local_1008 = local_3bc;
                local_1000 = local_3c8;
                local_ff4 = local_39c;
                local_ff0 = local_3a0;
                padding_constant_pack8_avx
                          (in_stack_ffffffffffffe900,
                           (Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                           in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0,
                           in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8,v);
                local_aa0 = &local_1020;
                local_798 = local_aa0;
                if (local_1018 != (int *)0x0) {
                  local_79c = 0xffffffff;
                  LOCK();
                  local_7a0 = *local_1018;
                  *local_1018 = *local_1018 + -1;
                  UNLOCK();
                  if (local_7a0 == 1) {
                    if (local_1000 == (Allocator *)0x0) {
                      local_5f8 = local_1020;
                      if (local_1020 != (void *)0x0) {
                        free(local_1020);
                      }
                    }
                    else {
                      (*local_1000->_vptr_Allocator[3])(local_1000,local_1020);
                    }
                  }
                }
                local_1020 = (void *)0x0;
                local_1010 = 0;
                local_1008 = 0;
                local_ff8 = 0;
                local_ff4 = 0;
                local_ff0 = 0;
                local_fec = 0;
                local_fe8 = 0;
                local_fe0 = 0;
                local_1018 = (int *)0x0;
              }
              local_a90 = &local_f90;
              local_7b8 = local_a90;
              if (local_f88 != (int *)0x0) {
                local_7bc = 0xffffffff;
                LOCK();
                local_7c0 = *local_f88;
                *local_f88 = *local_f88 + -1;
                UNLOCK();
                if (local_7c0 == 1) {
                  if (local_f70 == (Allocator *)0x0) {
                    local_5e8 = local_f90;
                    if (local_f90 != (undefined1 (*) [32])0x0) {
                      free(local_f90);
                    }
                  }
                  else {
                    (*local_f70->_vptr_Allocator[3])(local_f70,local_f90);
                  }
                }
              }
            }
          }
          return 0;
        }
        return -100;
      }
    }
  }
  if (local_d74 == 4) {
    if (local_d68 == 1) {
      local_106c = local_d58 * 4 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      if (local_106c % 8 == 0) {
        local_156c = 8;
      }
      else {
        local_156c = 1;
        if (local_106c % 4 == 0) {
          local_156c = 4;
        }
      }
      local_1070 = local_156c;
      local_1078 = (local_d70 / 4) * (long)local_156c;
      if (((*(int *)(in_RDI + 0xd8) % 4 == 0) && (local_156c == 4)) &&
         (*(int *)(in_RDI + 0xe0) == 0)) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                    in_stack_ffffffffffffe8f4,
                    CONCAT44(in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8),iVar4,
                    (Allocator *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
        local_ce0 = local_d48;
        bVar6 = true;
        if (local_d48->data != (void *)0x0) {
          local_528 = local_d48;
          bVar6 = local_d48->cstep * (long)local_d48->c == 0;
        }
        if (!bVar6) {
          local_950 = *(float *)(in_RDI + 0xe4);
          local_1090[1] = local_950;
          local_1090[0] = local_950;
          afStack_1088[1] = local_950;
          afStack_1088[0] = local_950;
          fStack_94c = local_950;
          fStack_948 = local_950;
          fStack_944 = local_950;
          local_93c = local_950;
          padding_constant_pack4_sse
                    (local_d40,local_d48,0,0,*(int *)(in_RDI + 0xd8) / 4,*(int *)(in_RDI + 0xdc) / 4
                     ,(__m128 *)local_1090);
          return 0;
        }
        return -100;
      }
    }
    if (local_d68 == 2) {
      local_1094 = local_d58 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_1098 = local_d5c * 4 + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      if (local_1098 % 8 == 0) {
        local_157c = 8;
      }
      else {
        local_157c = 1;
        if (local_1098 % 4 == 0) {
          local_157c = 4;
        }
      }
      local_109c = local_157c;
      local_10a8 = (local_d70 / 4) * (long)local_157c;
      if (((*(int *)(in_RDI + 0xd0) % 4 == 0) && (local_157c == 4)) &&
         (*(int *)(in_RDI + 0xe0) == 0)) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                    in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0,
                    CONCAT44(in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8),iVar4,
                    (Allocator *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
        local_ce8 = local_d48;
        bVar6 = true;
        if (local_d48->data != (void *)0x0) {
          local_520 = local_d48;
          bVar6 = local_d48->cstep * (long)local_d48->c == 0;
        }
        if (!bVar6) {
          local_970 = *(float *)(in_RDI + 0xe4);
          local_10c0[1] = local_970;
          local_10c0[0] = local_970;
          afStack_10b8[1] = local_970;
          afStack_10b8[0] = local_970;
          fStack_96c = local_970;
          fStack_968 = local_970;
          fStack_964 = local_970;
          local_954 = local_970;
          padding_constant_pack4_sse
                    (local_d40,local_d48,*(int *)(in_RDI + 0xd0) / 4,*(int *)(in_RDI + 0xd4) / 4,
                     *(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),(__m128 *)local_10c0);
          return 0;
        }
        return -100;
      }
    }
    if (local_d68 == 3) {
      local_10c4 = local_d58 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_10c8 = local_d5c + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      local_10cc = local_d64 * 4 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
      if (local_10cc % 8 == 0) {
        local_1590 = 8;
      }
      else {
        local_1590 = 1;
        if (local_10cc % 4 == 0) {
          local_1590 = 4;
        }
      }
      local_10d0 = local_1590;
      local_10d8 = (local_d70 / 4) * (long)local_1590;
      if (((*(int *)(in_RDI + 0xe8) % 4 == 0) && (local_1590 == 4)) &&
         ((local_10cc == local_d64 * 4 || (*(int *)(in_RDI + 0xe0) == 0)))) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
                    in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0,in_stack_ffffffffffffe8ec,
                    (size_t)in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
                    in_stack_ffffffffffffe958);
        local_cf0 = local_d48;
        bVar6 = true;
        if (local_d48->data != (void *)0x0) {
          local_518 = local_d48;
          bVar6 = local_d48->cstep * (long)local_d48->c == 0;
        }
        if (!bVar6) {
          local_10dc = *(int *)(in_RDI + 0xe8) / local_d74;
          for (local_10e0 = 0; local_10e0 < local_10cc / local_10d0; local_10e0 = local_10e0 + 1) {
            local_c80 = &local_1128;
            local_284 = local_d48->w;
            local_288 = local_d48->h;
            local_28c = local_d48->d;
            local_298 = (float *)((long)local_d48->data +
                                 local_d48->cstep * (long)local_10e0 * local_d48->elemsize);
            local_2a0 = local_d48->elemsize;
            local_2a4 = local_d48->elempack;
            local_2b0 = local_d48->allocator;
            local_280 = &local_1128;
            local_1128.refcount = (int *)0x0;
            local_1128.d = 1;
            local_228 = (long)local_284 * (long)local_288 * local_2a0;
            local_1128.cstep = (local_228 + 0xfU & 0xfffffffffffffff0) / local_2a0;
            local_1128.dims = local_d48->dims + -1;
            if (local_d48->dims == 4) {
              local_1128.cstep = (long)local_d48->w * (long)local_d48->h;
            }
            local_22c = 0x10;
            local_c8c = local_10e0;
            local_c8d = 1;
            if (*(int *)(in_RDI + 0xf0) == 0) {
              local_990 = *(float *)(in_RDI + 0xe4);
              local_15f0[1] = local_990;
              local_15f0[0] = local_990;
              afStack_15e8[1] = local_990;
              afStack_15e8[0] = local_990;
              fStack_98c = local_990;
              fStack_988 = local_990;
              fStack_984 = local_990;
              local_974 = local_990;
            }
            else {
              local_c30 = (long *)(in_RDI + 0xf8);
              local_930 = (float *)(*local_c30 + (long)(local_10e0 << 2) * 4);
              local_15f0 = *(float (*) [2])local_930;
              afStack_15e8._0_8_ = *(undefined8 *)(local_930 + 2);
            }
            local_1140[0] = local_15f0[0];
            local_1140[1] = local_15f0[1];
            afStack_1138[0] = afStack_15e8[0];
            afStack_1138[1] = afStack_15e8[1];
            local_1128.data = local_298;
            local_1128.elemsize = local_2a0;
            local_1128.elempack = local_2a4;
            local_1128.allocator = local_2b0;
            local_1128.w = local_284;
            local_1128.h = local_288;
            local_1128.c = local_28c;
            if ((local_10e0 - local_10dc < 0) || (local_d64 <= local_10e0 - local_10dc)) {
              local_8c8 = &local_1128;
              local_8e0[0] = local_15f0[0];
              local_8e0[1] = local_15f0[1];
              afStack_8d8[0] = afStack_15e8[0];
              afStack_8d8[1] = afStack_15e8[1];
              local_8e4 = (int)local_1128.cstep * local_28c;
              local_8f0 = local_298;
              for (local_8f4 = 0; local_568 = local_8c8, local_8f4 < local_8e4;
                  local_8f4 = local_8f4 + 1) {
                local_68 = local_8f0;
                local_80[0] = local_15f0[0];
                local_80[1] = local_15f0[1];
                afStack_78[0] = afStack_15e8[0];
                afStack_78[1] = afStack_15e8[1];
                *(float (*) [2])local_8f0 = local_15f0;
                *(undefined8 *)(local_8f0 + 2) = afStack_15e8._0_8_;
                local_8f0 = local_8f0 + 4;
              }
            }
            else {
              local_b64 = local_10e0 - local_10dc;
              local_b58 = &local_1188;
              local_364 = local_d40->w;
              local_368 = local_d40->h;
              local_36c = local_d40->d;
              local_378 = (void *)((long)local_d40->data +
                                  local_d40->cstep * (long)local_b64 * local_d40->elemsize);
              local_380 = local_d40->elemsize;
              local_384 = local_d40->elempack;
              local_390 = local_d40->allocator;
              local_360 = &local_1188;
              local_1188.refcount = (int *)0x0;
              local_1188.d = 1;
              local_1e8 = (long)local_364 * (long)local_368 * local_380;
              local_1188.cstep = (local_1e8 + 0xfU & 0xfffffffffffffff0) / local_380;
              local_1188.dims = local_d40->dims + -1;
              if (local_d40->dims == 4) {
                local_1188.cstep = (long)local_d40->w * (long)local_d40->h;
              }
              local_1ec = 0x10;
              local_22c = 0x10;
              local_b65 = 1;
              local_c8d = 1;
              afStack_1138[0] = afStack_15e8[0];
              afStack_1138[1] = afStack_15e8[1];
              local_1140[0] = local_15f0[0];
              local_1140[1] = local_15f0[1];
              local_1188.data = local_378;
              local_1188.elemsize = local_380;
              local_1188.elempack = local_384;
              local_1188.allocator = local_390;
              local_1188.w = local_364;
              local_1188.h = local_368;
              local_1188.c = local_36c;
              if (*(int *)(in_RDI + 0xe0) == 0) {
                padding_constant_pack4_sse
                          (&local_1188,&local_1128,*(int *)(in_RDI + 0xd0),*(int *)(in_RDI + 0xd4),
                           *(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),(__m128 *)local_1140);
              }
              if (*(int *)(in_RDI + 0xe0) == 1) {
                padding_replicate_pack4_sse
                          (in_stack_ffffffffffffe8e0,
                           (Mat *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8),
                           in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0,
                           (int)((ulong)in_stack_ffffffffffffe8c8 >> 0x20),
                           (int)in_stack_ffffffffffffe8c8);
              }
              if (*(int *)(in_RDI + 0xe0) == 2) {
                padding_reflect_pack4_sse
                          (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,
                           (int)((ulong)in_stack_ffffffffffffe990 >> 0x20),
                           (int)in_stack_ffffffffffffe990,
                           (int)((ulong)in_stack_ffffffffffffe988 >> 0x20),
                           (int)in_stack_ffffffffffffe988);
              }
              local_a80 = &local_1188;
              local_7d8 = local_a80;
              if (local_1188.refcount != (int *)0x0) {
                local_7dc = 0xffffffff;
                LOCK();
                local_7e0 = *local_1188.refcount;
                *local_1188.refcount = *local_1188.refcount + -1;
                UNLOCK();
                if (local_7e0 == 1) {
                  if (local_1188.allocator == (Allocator *)0x0) {
                    local_5d8 = local_1188.data;
                    if (local_1188.data != (void *)0x0) {
                      free(local_1188.data);
                    }
                  }
                  else {
                    (*(local_1188.allocator)->_vptr_Allocator[3])
                              (local_1188.allocator,local_1188.data);
                  }
                }
              }
              local_1188.data = (void *)0x0;
              local_1188.elemsize = 0;
              local_1188.elempack = 0;
              local_1188.dims = 0;
              local_1188.w = 0;
              local_1188.h = 0;
              local_1188.d = 0;
              local_1188.c = 0;
              local_1188.cstep = 0;
              local_1188.refcount = (int *)0x0;
            }
            local_a70 = &local_1128;
            local_7f8 = local_a70;
            if (local_1128.refcount != (int *)0x0) {
              local_7fc = 0xffffffff;
              LOCK();
              local_800 = *local_1128.refcount;
              *local_1128.refcount = *local_1128.refcount + -1;
              UNLOCK();
              if (local_800 == 1) {
                if (local_1128.allocator == (Allocator *)0x0) {
                  local_5c8 = (float *)local_1128.data;
                  if ((float *)local_1128.data != (float *)0x0) {
                    free(local_1128.data);
                  }
                }
                else {
                  (*(local_1128.allocator)->_vptr_Allocator[3])
                            (local_1128.allocator,local_1128.data);
                }
              }
            }
          }
          return 0;
        }
        return -100;
      }
    }
    if (local_d68 == 4) {
      local_118c = local_d58 + *(int *)(in_RDI + 0xd8) + *(int *)(in_RDI + 0xdc);
      local_1190 = local_d5c + *(int *)(in_RDI + 0xd0) + *(int *)(in_RDI + 0xd4);
      local_1194 = local_d60 + *(int *)(in_RDI + 0xe8) + *(int *)(in_RDI + 0xec);
      if (*(int *)(in_RDI + 0xe0) == 0) {
        Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8),iVar4,
                    (int)in_stack_ffffffffffffe8e0,in_stack_ffffffffffffe8dc,
                    in_stack_ffffffffffffe8d8,
                    CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
                    in_stack_ffffffffffffe948,in_stack_ffffffffffffe950);
        local_cf8 = local_d48;
        bVar6 = true;
        if (local_d48->data != (void *)0x0) {
          local_510 = local_d48;
          bVar6 = local_d48->cstep * (long)local_d48->c == 0;
        }
        if (!bVar6) {
          for (local_1198 = 0; local_1198 < local_d64; local_1198 = local_1198 + 1) {
            if (*(int *)(in_RDI + 0xf0) == 0) {
              local_9b0 = *(float *)(in_RDI + 0xe4);
              local_11b0[1] = local_9b0;
              local_11b0[0] = local_9b0;
              afStack_11a8[1] = local_9b0;
              afStack_11a8[0] = local_9b0;
              fStack_9ac = local_9b0;
              fStack_9a8 = local_9b0;
              fStack_9a4 = local_9b0;
              local_994 = local_9b0;
            }
            else {
              local_c38 = (long *)(in_RDI + 0xf8);
              local_938 = (float *)(*local_c38 + (long)(local_1198 << 2) * 4);
              local_11b0 = *(float (*) [2])local_938;
              afStack_11a8._0_8_ = *(undefined8 *)(local_938 + 2);
            }
            for (local_11b4 = 0; local_11b4 < local_1194; local_11b4 = local_11b4 + 1) {
              local_c98 = &local_1248;
              local_24c = local_d48->w;
              local_250 = local_d48->h;
              local_254 = local_d48->d;
              local_260 = (void *)((long)local_d48->data +
                                  local_d48->cstep * (long)local_1198 * local_d48->elemsize);
              local_268 = local_d48->elemsize;
              local_26c = local_d48->elempack;
              local_278 = local_d48->allocator;
              local_248 = &local_1248;
              local_238 = (long)local_24c * (long)local_250 * local_268;
              local_a00 = &local_1200;
              local_a08 = &local_1248;
              local_98 = (float *)((long)local_260 +
                                  (long)local_24c * (long)local_250 * (long)local_11b4 * local_268);
              local_88 = &local_1200;
              local_1200.cstep = (long)local_24c * (long)local_250;
              local_a60 = &local_1248;
              local_1200.c = 1;
              local_1200.d = 1;
              local_1200.dims = 2;
              local_1200.refcount = (int *)0x0;
              local_23c = 0x10;
              local_a0c = local_11b4;
              local_ca4 = local_1198;
              local_ca5 = 1;
              local_1248 = 0;
              local_1238 = 0;
              local_1230 = 0;
              local_1220 = 0;
              local_121c = 0;
              local_1218 = 0;
              local_1214 = 0;
              local_1210 = 0;
              local_1208 = 0;
              local_1240 = 0;
              local_818 = local_a60;
              local_b0 = local_278;
              local_a4 = local_26c;
              local_a0 = local_268;
              local_90 = local_250;
              local_8c = local_24c;
              local_1228 = local_278;
              local_1200.data = local_98;
              local_1200.elemsize = local_268;
              local_1200.elempack = local_26c;
              local_1200.allocator = local_278;
              local_1200.w = local_24c;
              local_1200.h = local_250;
              if ((local_11b4 - *(int *)(in_RDI + 0xe8) < 0) ||
                 (local_d60 <= local_11b4 - *(int *)(in_RDI + 0xe8))) {
                local_900 = &local_1200;
                local_910[0] = local_11b0[0];
                local_910[1] = local_11b0[1];
                afStack_908[0] = afStack_11a8[0];
                afStack_908[1] = afStack_11a8[1];
                local_914 = (int)local_1200.cstep;
                local_920 = local_98;
                for (local_924 = 0; local_560 = local_900, local_924 < local_914;
                    local_924 = local_924 + 1) {
                  local_48 = local_920;
                  local_60[0] = local_11b0[0];
                  local_60[1] = local_11b0[1];
                  afStack_58[0] = afStack_11a8[0];
                  afStack_58[1] = afStack_11a8[1];
                  *(float (*) [2])local_920 = local_11b0;
                  *(undefined8 *)(local_920 + 2) = afStack_11a8._0_8_;
                  local_920 = local_920 + 4;
                }
              }
              else {
                local_b70 = &local_12d8;
                local_32c = local_d40->w;
                local_330 = local_d40->h;
                local_334 = local_d40->d;
                local_340 = (void *)((long)local_d40->data +
                                    local_d40->cstep * (long)local_1198 * local_d40->elemsize);
                local_348 = local_d40->elemsize;
                local_34c = local_d40->elempack;
                local_358 = local_d40->allocator;
                local_328 = &local_12d8;
                uVar13 = 1;
                local_f0 = (int)in_stack_ffffffffffffed58;
                local_1f8 = (long)local_32c * (long)local_f0 * local_348;
                local_9dc = local_11b4 - *(int *)(in_RDI + 0xe8);
                local_9d0 = &local_1290;
                local_9d8 = &local_12d8;
                local_f8 = (void *)((long)local_340 +
                                   (long)local_32c * (long)local_f0 * (long)local_9dc * local_348);
                local_e8 = &local_1290;
                local_1290.cstep = (long)local_32c * (long)local_f0;
                local_a50 = &local_12d8;
                local_1200.c = 1;
                local_1200.d = 1;
                local_1200.dims = 2;
                local_1200.refcount = (int *)0x0;
                local_1210 = 0;
                local_1214 = 0;
                local_1218 = 0;
                local_121c = 0;
                local_1230 = 0;
                local_1238 = 0;
                local_1240 = 0;
                local_1248 = 0;
                local_1290.c = 1;
                local_1290.d = 1;
                local_1290.dims = 2;
                local_1290.refcount = (int *)0x0;
                local_1fc = 0x10;
                local_23c = 0x10;
                local_b7c = local_1198;
                local_b7d = 1;
                local_ca5 = 1;
                local_1208 = 0;
                local_1220 = 0;
                local_12d8 = 0;
                local_12c8 = 0;
                local_12c0 = 0;
                uVar13 = 0;
                local_12d0 = 0;
                local_838 = local_a50;
                local_104 = local_34c;
                local_100 = local_348;
                local_1290.data = local_f8;
                local_1290.elemsize = local_348;
                local_1290.elempack = local_34c;
                local_1290.allocator = local_358;
                local_1290.w = local_32c;
                local_1290.h = local_f0;
                padding_constant_pack4_sse
                          (&local_1290,&local_1200,*(int *)(in_RDI + 0xd0),*(int *)(in_RDI + 0xd4),
                           *(int *)(in_RDI + 0xd8),*(int *)(in_RDI + 0xdc),(__m128 *)local_11b0);
                local_a40 = &local_1290;
                local_858 = local_a40;
                if (local_1290.refcount != (int *)0x0) {
                  local_85c = 0xffffffff;
                  LOCK();
                  local_860 = *local_1290.refcount;
                  *local_1290.refcount = *local_1290.refcount + -1;
                  UNLOCK();
                  if (local_860 == 1) {
                    if (local_1290.allocator == (Allocator *)0x0) {
                      local_598 = local_1290.data;
                      if (local_1290.data != (void *)0x0) {
                        free(local_1290.data);
                      }
                    }
                    else {
                      (*(local_1290.allocator)->_vptr_Allocator[3])
                                (local_1290.allocator,local_1290.data);
                    }
                  }
                }
                local_1290.data = (void *)0x0;
                local_1290.elemsize = 0;
                local_1290.elempack = 0;
                local_1290.dims = 0;
                local_1290.w = 0;
                local_1290.h = 0;
                local_1290.d = 0;
                local_1290.c = 0;
                local_1290.cstep = 0;
                local_1290.refcount = (int *)0x0;
              }
              local_a30 = &local_1200;
              local_878 = local_a30;
              if (local_1200.refcount != (int *)0x0) {
                local_87c = 0xffffffff;
                LOCK();
                local_880 = *local_1200.refcount;
                *local_1200.refcount = *local_1200.refcount + -1;
                UNLOCK();
                if (local_880 == 1) {
                  if (local_1200.allocator == (Allocator *)0x0) {
                    local_588 = (float *)local_1200.data;
                    if ((float *)local_1200.data != (float *)0x0) {
                      free(local_1200.data);
                    }
                  }
                  else {
                    (*(local_1200.allocator)->_vptr_Allocator[3])
                              (local_1200.allocator,local_1200.data);
                  }
                }
              }
            }
          }
          return 0;
        }
        return -100;
      }
    }
  }
  local_8b8 = &local_1320;
  local_1320 = in_RSI->data;
  local_1318 = in_RSI->refcount;
  local_1310 = in_RSI->elemsize;
  local_1308 = in_RSI->elempack;
  local_1300 = in_RSI->allocator;
  local_12f8 = in_RSI->dims;
  local_12f4 = in_RSI->w;
  local_12f0 = in_RSI->h;
  local_12ec = in_RSI->d;
  local_12e8 = in_RSI->c;
  local_12e0 = in_RSI->cstep;
  if (local_1318 != (int *)0x0) {
    local_3c = 1;
    LOCK();
    local_40 = *local_1318;
    *local_1318 = *local_1318 + 1;
    UNLOCK();
  }
  local_38 = local_8b8;
  if (local_d74 != 1) {
    in_stack_ffffffffffffeca0 = (Option *)*in_RCX;
    in_stack_ffffffffffffecb0 = (Mat *)in_RCX[2];
    in_stack_ffffffffffffecb8 = (Padding *)in_RCX[3];
    in_stack_ffffffffffffeca8 = (Mat *)in_RCX[2];
    convert_packing((Mat *)CONCAT17(in_stack_ffffffffffffe90f,in_stack_ffffffffffffe908),
                    in_stack_ffffffffffffe900,in_stack_ffffffffffffe8fc,
                    (Option *)CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0));
    local_d00 = &local_1320;
    if (local_1320 != (void *)0x0) {
      local_508 = local_d00;
    }
    if (local_1320 == (void *)0x0 || local_12e0 * (long)local_12e8 == 0) {
      local_d2c = -100;
      goto LAB_01535510;
    }
  }
  local_d2c = Padding::forward(in_stack_ffffffffffffecb8,in_stack_ffffffffffffecb0,
                               in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
LAB_01535510:
  ppvVar11 = &local_1320;
  if (local_1318 != (int *)0x0) {
    local_89c = 0xffffffff;
    LOCK();
    local_8a0 = *local_1318;
    *local_1318 = *local_1318 + -1;
    UNLOCK();
    if (local_8a0 == 1) {
      local_a20 = ppvVar11;
      local_898 = ppvVar11;
      if (local_1300 == (Allocator *)0x0) {
        local_578 = local_1320;
        if (local_1320 != (void *)0x0) {
          free(local_1320);
        }
      }
      else {
        (*local_1300->_vptr_Allocator[3])(local_1300,local_1320);
      }
    }
  }
  *ppvVar11 = (void *)0x0;
  ppvVar11[2] = (void *)0x0;
  *(undefined4 *)(ppvVar11 + 3) = 0;
  *(undefined4 *)(ppvVar11 + 5) = 0;
  *(undefined4 *)((long)ppvVar11 + 0x2c) = 0;
  *(undefined4 *)(ppvVar11 + 6) = 0;
  *(undefined4 *)((long)ppvVar11 + 0x34) = 0;
  *(undefined4 *)(ppvVar11 + 7) = 0;
  ppvVar11[8] = (void *)0x0;
  ppvVar11[1] = (void *)0x0;
  return local_d2c;
}

Assistant:

int Padding_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}